

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathEqualValuesCommon
              (xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr arg1,xmlXPathObjectPtr arg2)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  int iVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  bool bVar6;
  uint local_24;
  xmlXPathObjectPtr pxStack_20;
  int ret;
  xmlXPathObjectPtr arg2_local;
  xmlXPathObjectPtr arg1_local;
  xmlXPathParserContextPtr ctxt_local;
  
  local_24 = 0;
  pxStack_20 = arg2;
  arg2_local = arg1;
  switch(arg1->type) {
  case XPATH_UNDEFINED:
    break;
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    break;
  case XPATH_BOOLEAN:
    switch(arg2->type) {
    case XPATH_UNDEFINED:
      break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      break;
    case XPATH_BOOLEAN:
      local_24 = (uint)(arg1->boolval == arg2->boolval);
      break;
    case XPATH_NUMBER:
      iVar3 = arg1->boolval;
      iVar2 = xmlXPathCastNumberToBoolean(arg2->floatval);
      local_24 = (uint)(iVar3 == iVar2);
      break;
    case XPATH_STRING:
      if ((arg2->stringval == (xmlChar *)0x0) || (*arg2->stringval == '\0')) {
        local_24 = 0;
      }
      else {
        local_24 = 1;
      }
      local_24 = (uint)(arg1->boolval == local_24);
      break;
    case XPATH_USERS:
      pp_Var4 = __xmlGenericError();
      p_Var1 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar5,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xpath.c",
                0x1b61);
    }
    break;
  case XPATH_NUMBER:
    switch(arg2->type) {
    case XPATH_UNDEFINED:
      break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      break;
    case XPATH_BOOLEAN:
      iVar3 = arg2->boolval;
      iVar2 = xmlXPathCastNumberToBoolean(arg1->floatval);
      local_24 = (uint)(iVar3 == iVar2);
      break;
    case XPATH_STRING:
      valuePush(ctxt,arg2);
      xmlXPathNumberFunction(ctxt,1);
      pxStack_20 = valuePop(ctxt);
    case XPATH_NUMBER:
      iVar3 = xmlXPathIsNaN(arg1->floatval);
      if ((iVar3 == 0) && (iVar3 = xmlXPathIsNaN(pxStack_20->floatval), iVar3 == 0)) {
        iVar3 = xmlXPathIsInf(arg1->floatval);
        if (iVar3 == 1) {
          iVar3 = xmlXPathIsInf(pxStack_20->floatval);
          bVar6 = iVar3 == 1;
        }
        else {
          iVar3 = xmlXPathIsInf(arg1->floatval);
          if (iVar3 == -1) {
            iVar3 = xmlXPathIsInf(pxStack_20->floatval);
            bVar6 = iVar3 == -1;
          }
          else {
            iVar3 = xmlXPathIsInf(pxStack_20->floatval);
            if (iVar3 == 1) {
              iVar3 = xmlXPathIsInf(arg1->floatval);
              bVar6 = iVar3 == 1;
            }
            else {
              iVar3 = xmlXPathIsInf(pxStack_20->floatval);
              if (iVar3 == -1) {
                iVar3 = xmlXPathIsInf(arg1->floatval);
                bVar6 = iVar3 == -1;
              }
              else {
                bVar6 = arg1->floatval == pxStack_20->floatval;
              }
            }
          }
        }
        local_24 = (uint)bVar6;
      }
      else {
        local_24 = 0;
      }
      break;
    case XPATH_USERS:
      pp_Var4 = __xmlGenericError();
      p_Var1 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar5,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xpath.c",
                0x1b9c);
    }
    break;
  case XPATH_STRING:
    switch(arg2->type) {
    case XPATH_UNDEFINED:
      break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      break;
    case XPATH_BOOLEAN:
      if ((arg1->stringval == (xmlChar *)0x0) || (*arg1->stringval == '\0')) {
        local_24 = 0;
      }
      else {
        local_24 = 1;
      }
      local_24 = (uint)(arg2->boolval == local_24);
      break;
    case XPATH_NUMBER:
      valuePush(ctxt,arg1);
      xmlXPathNumberFunction(ctxt,1);
      arg2_local = valuePop(ctxt);
      iVar3 = xmlXPathIsNaN(arg2_local->floatval);
      if ((iVar3 == 0) && (iVar3 = xmlXPathIsNaN(arg2->floatval), iVar3 == 0)) {
        iVar3 = xmlXPathIsInf(arg2_local->floatval);
        if (iVar3 == 1) {
          iVar3 = xmlXPathIsInf(arg2->floatval);
          bVar6 = iVar3 == 1;
        }
        else {
          iVar3 = xmlXPathIsInf(arg2_local->floatval);
          if (iVar3 == -1) {
            iVar3 = xmlXPathIsInf(arg2->floatval);
            bVar6 = iVar3 == -1;
          }
          else {
            iVar3 = xmlXPathIsInf(arg2->floatval);
            if (iVar3 == 1) {
              iVar3 = xmlXPathIsInf(arg2_local->floatval);
              bVar6 = iVar3 == 1;
            }
            else {
              iVar3 = xmlXPathIsInf(arg2->floatval);
              if (iVar3 == -1) {
                iVar3 = xmlXPathIsInf(arg2_local->floatval);
                bVar6 = iVar3 == -1;
              }
              else {
                bVar6 = arg2_local->floatval == arg2->floatval;
              }
            }
          }
        }
        local_24 = (uint)bVar6;
      }
      else {
        local_24 = 0;
      }
      break;
    case XPATH_STRING:
      local_24 = xmlStrEqual(arg1->stringval,arg2->stringval);
      break;
    case XPATH_USERS:
      pp_Var4 = __xmlGenericError();
      p_Var1 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar5,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xpath.c",
                0x1bdb);
    }
    break;
  case XPATH_USERS:
    pp_Var4 = __xmlGenericError();
    p_Var1 = *pp_Var4;
    ppvVar5 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar5,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xpath.c",
              0x1be8);
  }
  xmlXPathReleaseObject(ctxt->context,arg2_local);
  xmlXPathReleaseObject(ctxt->context,pxStack_20);
  return local_24;
}

Assistant:

static int
xmlXPathEqualValuesCommon(xmlXPathParserContextPtr ctxt,
  xmlXPathObjectPtr arg1, xmlXPathObjectPtr arg2) {
    int ret = 0;
    /*
     *At this point we are assured neither arg1 nor arg2
     *is a nodeset, so we can just pick the appropriate routine.
     */
    switch (arg1->type) {
        case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
	    xmlGenericError(xmlGenericErrorContext,
		    "Equal: undefined\n");
#endif
	    break;
        case XPATH_BOOLEAN:
	    switch (arg2->type) {
	        case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
		    xmlGenericError(xmlGenericErrorContext,
			    "Equal: undefined\n");
#endif
		    break;
		case XPATH_BOOLEAN:
#ifdef DEBUG_EXPR
		    xmlGenericError(xmlGenericErrorContext,
			    "Equal: %d boolean %d \n",
			    arg1->boolval, arg2->boolval);
#endif
		    ret = (arg1->boolval == arg2->boolval);
		    break;
		case XPATH_NUMBER:
		    ret = (arg1->boolval ==
			   xmlXPathCastNumberToBoolean(arg2->floatval));
		    break;
		case XPATH_STRING:
		    if ((arg2->stringval == NULL) ||
			(arg2->stringval[0] == 0)) ret = 0;
		    else
			ret = 1;
		    ret = (arg1->boolval == ret);
		    break;
		case XPATH_USERS:
#ifdef LIBXML_XPTR_LOCS_ENABLED
		case XPATH_POINT:
		case XPATH_RANGE:
		case XPATH_LOCATIONSET:
#endif /* LIBXML_XPTR_LOCS_ENABLED */
		    TODO
		    break;
		case XPATH_NODESET:
		case XPATH_XSLT_TREE:
		    break;
	    }
	    break;
        case XPATH_NUMBER:
	    switch (arg2->type) {
	        case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
		    xmlGenericError(xmlGenericErrorContext,
			    "Equal: undefined\n");
#endif
		    break;
		case XPATH_BOOLEAN:
		    ret = (arg2->boolval==
			   xmlXPathCastNumberToBoolean(arg1->floatval));
		    break;
		case XPATH_STRING:
		    valuePush(ctxt, arg2);
		    xmlXPathNumberFunction(ctxt, 1);
		    arg2 = valuePop(ctxt);
                    /* Falls through. */
		case XPATH_NUMBER:
		    /* Hand check NaN and Infinity equalities */
		    if (xmlXPathIsNaN(arg1->floatval) ||
			    xmlXPathIsNaN(arg2->floatval)) {
		        ret = 0;
		    } else if (xmlXPathIsInf(arg1->floatval) == 1) {
		        if (xmlXPathIsInf(arg2->floatval) == 1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg1->floatval) == -1) {
			if (xmlXPathIsInf(arg2->floatval) == -1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg2->floatval) == 1) {
			if (xmlXPathIsInf(arg1->floatval) == 1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg2->floatval) == -1) {
			if (xmlXPathIsInf(arg1->floatval) == -1)
			    ret = 1;
			else
			    ret = 0;
		    } else {
		        ret = (arg1->floatval == arg2->floatval);
		    }
		    break;
		case XPATH_USERS:
#ifdef LIBXML_XPTR_LOCS_ENABLED
		case XPATH_POINT:
		case XPATH_RANGE:
		case XPATH_LOCATIONSET:
#endif /* LIBXML_XPTR_LOCS_ENABLED */
		    TODO
		    break;
		case XPATH_NODESET:
		case XPATH_XSLT_TREE:
		    break;
	    }
	    break;
        case XPATH_STRING:
	    switch (arg2->type) {
	        case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
		    xmlGenericError(xmlGenericErrorContext,
			    "Equal: undefined\n");
#endif
		    break;
		case XPATH_BOOLEAN:
		    if ((arg1->stringval == NULL) ||
			(arg1->stringval[0] == 0)) ret = 0;
		    else
			ret = 1;
		    ret = (arg2->boolval == ret);
		    break;
		case XPATH_STRING:
		    ret = xmlStrEqual(arg1->stringval, arg2->stringval);
		    break;
		case XPATH_NUMBER:
		    valuePush(ctxt, arg1);
		    xmlXPathNumberFunction(ctxt, 1);
		    arg1 = valuePop(ctxt);
		    /* Hand check NaN and Infinity equalities */
		    if (xmlXPathIsNaN(arg1->floatval) ||
			    xmlXPathIsNaN(arg2->floatval)) {
		        ret = 0;
		    } else if (xmlXPathIsInf(arg1->floatval) == 1) {
			if (xmlXPathIsInf(arg2->floatval) == 1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg1->floatval) == -1) {
			if (xmlXPathIsInf(arg2->floatval) == -1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg2->floatval) == 1) {
			if (xmlXPathIsInf(arg1->floatval) == 1)
			    ret = 1;
			else
			    ret = 0;
		    } else if (xmlXPathIsInf(arg2->floatval) == -1) {
			if (xmlXPathIsInf(arg1->floatval) == -1)
			    ret = 1;
			else
			    ret = 0;
		    } else {
		        ret = (arg1->floatval == arg2->floatval);
		    }
		    break;
		case XPATH_USERS:
#ifdef LIBXML_XPTR_LOCS_ENABLED
		case XPATH_POINT:
		case XPATH_RANGE:
		case XPATH_LOCATIONSET:
#endif /* LIBXML_XPTR_LOCS_ENABLED */
		    TODO
		    break;
		case XPATH_NODESET:
		case XPATH_XSLT_TREE:
		    break;
	    }
	    break;
        case XPATH_USERS:
#ifdef LIBXML_XPTR_LOCS_ENABLED
	case XPATH_POINT:
	case XPATH_RANGE:
	case XPATH_LOCATIONSET:
#endif /* LIBXML_XPTR_LOCS_ENABLED */
	    TODO
	    break;
	case XPATH_NODESET:
	case XPATH_XSLT_TREE:
	    break;
    }
    xmlXPathReleaseObject(ctxt->context, arg1);
    xmlXPathReleaseObject(ctxt->context, arg2);
    return(ret);
}